

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdynfunc.cpp
# Opt level: O2

CTcSymbol * __thiscall
CVmDynFuncSymtab::find_local(CVmDynFuncSymtab *this,textchar_t *sym,size_t len)

{
  int iVar1;
  int iVar2;
  CTcSymbol *pCVar3;
  int idx;
  vm_val_t ele;
  vm_val_t lt;
  
  if (this->locals_ != 0) {
    iVar1 = CVmObjFrameDesc::is_framedesc_obj(this->locals_);
    if (iVar1 != 0) {
      pCVar3 = find_local(this,sym,len,this->locals_);
      return pCVar3;
    }
    lt.val.obj = this->locals_;
    lt.typ = VM_OBJ;
    iVar1 = vm_val_t::ll_length(&lt);
    if (iVar1 < 1) {
      iVar1 = 0;
    }
    for (idx = 1; idx - iVar1 != 1; idx = idx + 1) {
      vm_val_t::ll_index(&lt,&ele,idx);
      if (((ele.typ == VM_OBJ) &&
          (iVar2 = CVmObjFrameDesc::is_framedesc_obj(ele.val.obj), iVar2 != 0)) &&
         (pCVar3 = find_local(this,sym,len,ele.val.obj), pCVar3 != (CTcSymbol *)0x0)) {
        return pCVar3;
      }
    }
  }
  return (CTcSymbol *)0x0;
}

Assistant:

CTcSymbol *find_local(const textchar_t *sym, size_t len)
    {
        /* if there's no user-code table, there's nothing to search */
        if (locals_ == VM_INVALID_OBJ)
            return 0;

        /* establish access to globals */
        VMGLOB_PTR(gptr_);

        /* 
         *   if it's a StackFrameDesc object, look up the symbol; otherwise
         *   try to treat it as a list-like object, and check each element of
         *   the list 
         */
        if (CVmObjFrameDesc::is_framedesc_obj(vmg_ locals_))
        {
            /* look up the value in our single table */
            return find_local(sym, len, locals_);
        }
        else
        {
            /* assume it's a list - set up an object value */
            vm_val_t lt;
            lt.set_obj(locals_);
            
            /* check each list element */
            int n = lt.ll_length(vmg0_);
            for (int i = 1 ; i <= n ; ++i)
            {
                /* get this element */
                vm_val_t ele;
                lt.ll_index(vmg_ &ele, i);

                /* if it's a StackFrameDesc object, check it */
                if (ele.typ == VM_OBJ
                    && CVmObjFrameDesc::is_framedesc_obj(vmg_ ele.val.obj))
                {
                    /* look up the value in this table */
                    CTcSymbol *ret = find_local(sym, len, ele.val.obj);

                    /* if we found it, return the value */
                    if (ret != 0)
                        return ret;
                }
            }

            /* we didn't find a value */
            return 0;
        }